

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Limiter.cpp
# Opt level: O2

string * __thiscall
ninx::lexer::token::Limiter::dump_abi_cxx11_(string *__return_storage_ptr__,Limiter *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_48.field_2._M_local_buf[0] = (this->super_Token).field_0xc;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 1;
  local_48.field_2._M_local_buf[1] = '\0';
  std::operator+(&local_28,"LIMITER: \'",&local_48);
  std::operator+(__return_storage_ptr__,&local_28,"\'");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::token::Limiter::dump() const {
    return "LIMITER: '" + std::string{ this->limiter } + "'";
}